

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O2

Clause * __thiscall
Shell::AnswerLiteralManager::getResolverClause(AnswerLiteralManager *this,uint pred)

{
  uint arity;
  bool bVar1;
  int iVar2;
  Literal *pLVar3;
  Inference *inf;
  ulong uVar4;
  SingletonIterator<Kernel::Literal_*> litit;
  uint pred_local;
  NonspecificInference0 local_62;
  Clause *res;
  Inference local_58;
  
  pred_local = pred;
  bVar1 = Lib::DHMap<unsigned_int,_Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                    (&this->_resolverClauses,&pred_local,&res);
  if (!bVar1) {
    if (getResolverClause(unsigned_int)::args == '\0') {
      iVar2 = __cxa_guard_acquire(&getResolverClause(unsigned_int)::args);
      if (iVar2 != 0) {
        getResolverClause::args._cursor = (TermList *)0x0;
        getResolverClause::args._end = (TermList *)0x0;
        getResolverClause::args._capacity = 0;
        getResolverClause::args._stack = (TermList *)0x0;
        __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&getResolverClause::args,&__dso_handle);
        __cxa_guard_release(&getResolverClause(unsigned_int)::args);
      }
    }
    getResolverClause::args._cursor = getResolverClause::args._stack;
    arity = *(uint *)(*(long *)(*(long *)(DAT_00a14190 + 0x80) + (ulong)pred_local * 8) + 0x20);
    for (uVar4 = 0; (ulong)arity << 2 != uVar4; uVar4 = uVar4 + 4) {
      Lib::Stack<Kernel::TermList>::push
                (&getResolverClause::args,(TermList)((uVar4 & 0xffffffff) + 1));
    }
    inf = (Inference *)getResolverClause::args._stack;
    pLVar3 = Kernel::Literal::create(pred_local,arity,true,getResolverClause::args._stack);
    local_62.inputType = AXIOM;
    local_62.rule = ANSWER_LITERAL_RESOLVER;
    Kernel::Inference::Inference(&local_58,&local_62);
    litit._el = (Literal *)&local_58;
    litit._0_8_ = pLVar3;
    res = Kernel::Clause::fromIterator<Lib::SingletonIterator<Kernel::Literal*>>
                    ((Clause *)0x0,litit,inf);
    Lib::DHMap<unsigned_int,_Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (&this->_resolverClauses,pred_local,res);
  }
  return res;
}

Assistant:

Clause* AnswerLiteralManager::getResolverClause(unsigned pred)
{
  Clause* res;
  if(_resolverClauses.find(pred, res)) {
    return res;
  }

  static Stack<TermList> args;
  args.reset();

  Signature::Symbol* predSym = env.signature->getPredicate(pred);
  ASS(predSym->answerPredicate());
  unsigned arity = predSym->arity();

  for(unsigned i=0; i<arity; i++) {
    args.push(TermList(i, false));
  }
  Literal* lit = Literal::create(pred, arity, true, args.begin());
  res = Clause::fromIterator(getSingletonIterator(lit),NonspecificInference0(UnitInputType::AXIOM,InferenceRule::ANSWER_LITERAL_RESOLVER));

  _resolverClauses.insert(pred, res);
  return res;
}